

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_make_obj_name(voccxdef *ctx,char *namebuf,char **cmd,int firstwrd,int lastwrd)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  voccxdef *in_RDI;
  int in_R8D;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  
  *in_RSI = '\0';
  iVar4 = in_ECX;
  for (; in_ECX < in_R8D; in_ECX = in_ECX + 1) {
    iVar2 = voc_check_special(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
    if (iVar2 == 0) {
      strcat(in_RSI,*(char **)(in_RDX + (long)in_ECX * 8));
    }
    else {
      vocaddof((voccxdef *)CONCAT44(iVar4,in_R8D),(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8)
              );
    }
    lVar1 = *(long *)(in_RDX + (long)in_ECX * 8);
    sVar3 = strlen(*(char **)(in_RDX + (long)in_ECX * 8));
    if ((*(char *)(lVar1 + (sVar3 - 1)) == '.') && (in_ECX + 1 < in_R8D)) {
      strcat(in_RSI,"\\");
    }
    if (in_ECX + 1 < in_R8D) {
      strcat(in_RSI," ");
    }
  }
  return;
}

Assistant:

void voc_make_obj_name(voccxdef *ctx, char *namebuf, char *cmd[],
                       int firstwrd, int lastwrd)
{
    int i;
    
    /* run through the range of words, and add them to the buffer */
    for (i = firstwrd, namebuf[0] = '\0' ; i < lastwrd ; ++i)
    {
        if (voc_check_special(ctx, cmd[i], VOCW_OF))
            vocaddof(ctx, namebuf);
        else
            strcat(namebuf, cmd[i]);
        
        if (cmd[i][strlen(cmd[i])-1] == '.' && i + 1 < lastwrd)
            strcat(namebuf, "\\");

        if (i + 1 < lastwrd)
            strcat(namebuf, " ");
    }
}